

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O0

Value * evaluate_expression(Scope *scope,Expression *expression)

{
  Value **items_00;
  Value *pVVar1;
  Variable *pVVar2;
  char *function_name;
  FunctionValue *function_value;
  FunctionExpression *function_expression;
  Variable *variable;
  StringLiteral *string_literal;
  size_t i;
  Value **items;
  ArrayExpression *array_expression;
  IndexExpression *index_expression;
  Expression *expression_local;
  Scope *scope_local;
  
  switch(expression->expression_type) {
  case ExpressionTypeNullExpression:
    scope_local = (Scope *)new_null_value();
    break;
  case ExpressionTypeIntegerExpression:
    scope_local = (Scope *)new_integer_value_from_literal((IntegerLiteral *)expression->literal);
    break;
  case ExpressionTypeFloatExpression:
    scope_local = (Scope *)new_float_value_from_literal((FloatLiteral *)expression->literal);
    break;
  case ExpressionTypeStringExpression:
    scope_local = (Scope *)new_string_value_from_literal((StringLiteral *)expression->literal);
    break;
  case ExpressionTypeBoolExpression:
    scope_local = (Scope *)new_bool_value((_Bool)((char)expression->literal[1].literal_type &
                                                 LiteralTypeIntegerLiteral));
    break;
  case ExpressionTypeInfixExpression:
    scope_local = (Scope *)evaluate_infix_expression(scope,(InfixExpression *)expression);
    break;
  case ExpressionTypePrefixExpression:
    scope_local = (Scope *)evaluate_prefix_expression(scope,(PrefixExpression *)expression);
    break;
  case ExpressionTypeCallExpression:
    scope_local = (Scope *)evaluate_call_expression(scope,(CallExpression *)expression);
    break;
  case ExpressionTypeArrayExpression:
    items_00 = (Value **)calloc((size_t)expression[1].literal,8);
    for (string_literal = (StringLiteral *)0x0;
        string_literal < (StringLiteral *)expression[1].literal;
        string_literal = (StringLiteral *)((long)&(string_literal->literal).literal_type + 1)) {
      pVVar1 = evaluate_expression(scope,*(Expression **)
                                          (*(long *)(expression + 1) + (long)string_literal * 8));
      items_00[(long)string_literal] = pVVar1;
      items_00[(long)string_literal]->linked_variable_count =
           items_00[(long)string_literal]->linked_variable_count + 1;
    }
    if (expression[2].expression_type == ExpressionTypeFloatExpression) {
      pVVar1 = new_tuple_value(items_00,(size_t)expression[1].literal,
                               (_Bool)(expression[2].field_0x4 & 1));
      return pVVar1;
    }
    if (expression[2].expression_type == ExpressionTypeIntegerExpression) {
      pVVar1 = new_list_value(items_00,(size_t)expression[1].literal,
                              (_Bool)(expression[2].field_0x4 & 1));
      return pVVar1;
    }
  case ExpressionTypeIdentifierExpression:
    pVVar2 = scope_get_variable(scope,ValueTypeNullValue,*(char **)(expression->literal + 2));
    if (pVVar2 == (Variable *)0x0) {
      scope_local = (Scope *)new_null_value();
    }
    else {
      scope_local = (Scope *)pVVar2->value;
    }
    break;
  case ExpressionTypeIndexExpression:
    scope_local = (Scope *)evaluate_index_expression(scope,(IndexExpression *)expression);
    break;
  case ExpressionTypeFunctionExpression:
    scope_local = (Scope *)new_function_value(*(Block **)(expression + 1),
                                              *(char ***)(expression + 2),
                                              (size_t)expression[2].literal);
    if (expression[1].literal != (Literal *)0x0) {
      scope_set_variable(scope,ValueTypeNullValue,
                         *(char **)(*(long *)(expression[1].literal + 2) + 8),(Value *)scope_local,0
                        );
    }
    break;
  default:
    scope_local = (Scope *)new_null_value();
  }
  return (Value *)scope_local;
}

Assistant:

Value *evaluate_expression(Scope *scope, Expression *expression) {
  switch (expression->expression_type) {
    case ExpressionTypeNullExpression: {
      return new_null_value();
    }

    case ExpressionTypeBoolExpression: {
      return new_bool_value(((BoolLiteral *) expression->literal)->bool_literal);
    }

    case ExpressionTypeIntegerExpression: {
      return new_integer_value_from_literal((IntegerLiteral *) expression->literal);
    }

    case ExpressionTypeFloatExpression: {
      return new_float_value_from_literal((FloatLiteral *) expression->literal);
    }

    case ExpressionTypeStringExpression: {
      return new_string_value_from_literal((StringLiteral *) expression->literal);
    }

    case ExpressionTypeInfixExpression: {
      return evaluate_infix_expression(scope, (InfixExpression *) expression);
    }

    case ExpressionTypePrefixExpression: {
      return evaluate_prefix_expression(scope, (PrefixExpression *) expression);
    }

    case ExpressionTypeIndexExpression: {
      IndexExpression *index_expression = (IndexExpression *) expression;

      return evaluate_index_expression(scope, index_expression);
    }

    case ExpressionTypeArrayExpression: {
      ArrayExpression *array_expression = (ArrayExpression *) expression;

      Value **items = calloc(array_expression->expression_count, sizeof(Value *));

      for (size_t i = 0; i < array_expression->expression_count; i++) {
        items[i] = evaluate_expression(scope, array_expression->expressions[i]);
        items[i]->linked_variable_count++;
      }

      if (array_expression->array_expression_type == ArrayExpressionTypeTuple) {
        return new_tuple_value(items, array_expression->expression_count, array_expression->has_finished);
      }
      else if (array_expression->array_expression_type == ArrayExpressionTypeList) {
        return new_list_value(items, array_expression->expression_count, array_expression->has_finished);
      }
    }

    case ExpressionTypeIdentifierExpression: {
      StringLiteral *string_literal = (StringLiteral *) expression->literal;

      Variable *variable = scope_get_variable(scope, ValueTypeNullValue, string_literal->string_literal);

      if (variable == NULL) {
        return new_null_value();
      }

      return variable->value;
    }

    case ExpressionTypeCallExpression: {
      return evaluate_call_expression(scope, (CallExpression *) expression);
    }

    case ExpressionTypeFunctionExpression: {
      FunctionExpression *function_expression = (FunctionExpression *) expression;

      FunctionValue *function_value = (FunctionValue *) new_function_value(function_expression->block, function_expression->arguments, function_expression->argument_count);

      if (function_expression->identifier != NULL) {
        char *function_name = ((StringLiteral *) function_expression->identifier->literal)->string_literal;

        scope_set_variable(scope, ValueTypeNullValue, function_name, (Value *) function_value, false);
      }

      return (Value *) function_value;
    }
  }

  return new_null_value();
}